

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_filename.c
# Opt level: O2

void test_read_format_zip_filename_KOI8R_CP866(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_conflict *a;
  la_int64_t lVar4;
  archive_entry *ae;
  
  pcVar3 = setlocale(6,"Russian_Russia.866");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = setlocale(6,"ru_RU.CP866");
    if (pcVar3 == (char *)0x0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                     ,L'ǌ');
      test_skipping("ru_RU.CP866 locale not available on this system.");
      return;
    }
  }
  extract_reference_file("test_read_format_zip_filename_koi8r.zip");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                   ,L'Ǒ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L'ǒ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L'Ǔ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  iVar1 = archive_read_set_options((archive *)a,"hdrcharset=KOI8-R");
  if (iVar1 == 0) {
    wVar2 = archive_read_open_filename(a,"test_read_format_zip_filename_koi8r.zip",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ǚ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ǝ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar3 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'ǟ',anon_var_dwarf_6b69e,"\"\\xaf\\xe0\\xa8\\xa2\\xa5\\xe2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ǡ',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ǡ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ǣ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ǥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar3 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'ǧ',anon_var_dwarf_6b688,"\"\\x8f\\x90\\x88\\x82\\x85\\x92\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ǩ',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ǩ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ǫ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ǯ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'Ǳ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
    iVar1 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ǲ',0x50000,"ARCHIVE_FORMAT_ZIP",(long)iVar1,"archive_format(a)",a);
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'ǵ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                   ,L'Ǖ');
    test_skipping("This system cannot convert character-set from KOI8-R to CP866.");
  }
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L'Ƿ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_filename_KOI8R_CP866)
{
	const char *refname = "test_read_format_zip_filename_koi8r.zip";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read KOI8-R filename in ru_RU.CP866 with "hdrcharset=KOI8-R" option.
	 */
	if (NULL == setlocale(LC_ALL, "Russian_Russia.866") &&
	    NULL == setlocale(LC_ALL, "ru_RU.CP866")) {
		skipping("ru_RU.CP866 locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=KOI8-R")) {
		skipping("This system cannot convert character-set"
		    " from KOI8-R to CP866.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xaf\xe0\xa8\xa2\xa5\xe2",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\x8f\x90\x88\x82\x85\x92",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}